

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osgen3.c
# Opt level: O0

void osgen_update_stat_right(void)

{
  osgen_txtwin_t *poVar1;
  size_t sVar2;
  size_t cur;
  char buf [64];
  size_t char_len;
  int wid_rem;
  osgen_txtwin_t *win;
  undefined8 in_stack_ffffffffffffff98;
  int draw;
  ulong in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  osgen_txtwin_t *in_stack_ffffffffffffffb0;
  int local_c;
  
  poVar1 = S_status_win;
  if ((S_status_win != (osgen_txtwin_t *)0x0) && (S_stat_reset_free != (char *)0x0)) {
    S_status_win->txtfree = S_stat_reset_free;
    (poVar1->base).x = S_stat_reset_x;
    if ((poVar1->base).x <= (int)(poVar1->base).wid) {
      local_c = (int)(poVar1->base).wid - (poVar1->base).x;
      sVar2 = strlen(S_scorebuf);
      draw = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20);
      if ((int)sVar2 + 1 < local_c) {
        for (; (int)sVar2 + 1 < local_c; local_c = local_c - (int)in_stack_ffffffffffffffa0) {
          in_stack_ffffffffffffffa0 = ((long)local_c - sVar2) - 1;
          if (0x3f < in_stack_ffffffffffffffa0) {
            in_stack_ffffffffffffffa0 = 0x3f;
          }
          memset(&stack0xffffffffffffffa8,0x20,in_stack_ffffffffffffffa0);
          ossaddsb(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                   draw);
        }
        strlen(S_scorebuf);
        ossaddsb(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,draw)
        ;
      }
      else {
        ossaddsb(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,draw)
        ;
        strlen(S_scorebuf);
        ossaddsb(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                 (int)((ulong)poVar1 >> 0x20));
      }
    }
  }
  return;
}

Assistant:

static void osgen_update_stat_right()
{
    osgen_txtwin_t *win;
    int wid_rem;
    size_t char_len;
    
    /* 
     *   if there's no statusline window, or no reset point, we can't do
     *   anything right now 
     */
    if ((win = S_status_win) == 0 || S_stat_reset_free == 0)
        return;

    /* 
     *   set the statusline position back to where it was when we finished
     *   with the statusline itself
     */
    win->txtfree = S_stat_reset_free;
    win->base.x = S_stat_reset_x;

    /* if there's no space, don't draw anything */
    if (win->base.x > (int)win->base.wid)
        return;

    /* figure out how much space in the window we have */
    wid_rem = win->base.wid - win->base.x;

    /* figure out how much we're adding */
    char_len = strlen(S_scorebuf);

    /* 
     *   if we're adding more than we have room for, add a space and then
     *   add the buffer contents 
     */
    if ((int)char_len + 1 >= wid_rem)
    {
        /* add a space */
        ossaddsb(win, " ", 1, TRUE);

        /* add the right-half string */
        ossaddsb(win, S_scorebuf, strlen(S_scorebuf), TRUE);
    }
    else
    {
        /* add spaces to right-align the scorebuf text */
        while (wid_rem > (int)char_len + 1)
        {
            char buf[64];
            size_t cur;
            
            /* add the remaining spaces, up to a buffer-full */
            cur = wid_rem - char_len - 1;
            if (cur > sizeof(buf) - 1)
                cur = sizeof(buf) - 1;

            /* make a buffer-full of spaces */
            memset(buf, ' ', cur);

            /* display it */
            ossaddsb(win, buf, cur, TRUE);

            /* deduct the amount we displayed from the width remaining */
            wid_rem -= cur;
        }

        /* add the right-half string */
        ossaddsb(win, S_scorebuf, strlen(S_scorebuf), TRUE);
    }
}